

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O1

int __thiscall ArgParser::ArgIterator::count(ArgIterator *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  logic_error *this_00;
  code *pcVar4;
  undefined *puVar5;
  char *pcVar6;
  bool bVar7;
  
  if (this->i == this->argc) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error((range_error *)this_00,"arg out of range");
    puVar5 = &std::range_error::typeinfo;
    pcVar4 = std::range_error::~range_error;
  }
  else {
    if (this->longmatch == true) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"can\'t count a --long option");
    }
    else {
      pcVar2 = this->p;
      pcVar3 = this->pend;
      bVar7 = pcVar2 + 1 == pcVar3;
      if (bVar7) {
LAB_00108ced:
        return (int)pcVar3 + ~(uint)pcVar2;
      }
      if (pcVar2[1] == pcVar2[1]) {
        pcVar6 = pcVar2 + 2;
        do {
          bVar7 = pcVar6 == pcVar3;
          if (bVar7) goto LAB_00108ced;
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar1 == pcVar2[1]);
      }
      if (bVar7) goto LAB_00108ced;
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"counted options must all be equal");
    }
    puVar5 = &std::logic_error::typeinfo;
    pcVar4 = std::logic_error::~logic_error;
  }
  __cxa_throw(this_00,puVar5,pcVar4);
}

Assistant:

int count()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (longmatch)
                throw std::logic_error("can't count a --long option");
            char opt = p[1];
            const char *q = p+1;

            while (q!=pend && *q==opt)
                ++q;

            if (q!=pend)
                throw std::logic_error("counted options must all be equal");

            return pend - p - 1;
        }